

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O3

Stats * Enhedron::Test::Impl::Impl_Suite::Register::run
                  (Stats *__return_storage_ptr__,PathList *pathList,
                  Out<Enhedron::Test::Impl::Impl_Results::Results> results)

{
  pointer puVar1;
  Context *pCVar2;
  Register *pRVar3;
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  *context;
  pointer puVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ContextResultsRecorder resultsRecorder;
  uint64_t local_a8;
  uint64_t uStack_a0;
  long local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  undefined **local_58;
  Results *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __return_storage_ptr__->failedChecks_ = 0;
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  local_58 = &PTR_notifyPassing_0016c138;
  local_a8 = 0;
  uStack_a0 = 0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = results.value;
  pRVar3 = instance();
  puVar4 = (pRVar3->contextList).
           super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pRVar3->contextList).
           super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    do {
      pCVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               ._M_t.
               super__Tuple_impl<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
               .super__Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false>.
               _M_head_impl;
      (*pCVar2->_vptr_Context[3])(&local_88,pCVar2,pathList,&local_58,0);
      local_a8 = local_a8 + local_88;
      uStack_a0 = uStack_a0 + lStack_80;
      uVar5 = uVar5 + local_68;
      __return_storage_ptr__->fixtures_ = local_a8;
      __return_storage_ptr__->tests_ = uStack_a0;
      uVar6 = uVar6 + local_78;
      uVar7 = uVar7 + lStack_70;
      __return_storage_ptr__->checks_ = uVar6;
      __return_storage_ptr__->failedTests_ = uVar7;
      __return_storage_ptr__->failedChecks_ = uVar5;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  (*(results.value)->_vptr_Results[2])(results.value,__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static Stats run(const PathList& pathList, Out<Results> results) {
            Stats stats;

            ContextResultsRecorder resultsRecorder(results);

            for (const auto& context : instance().contextList) {
                stats += context->run(pathList, out(resultsRecorder), 0);
            }

            results->finish(stats);
            return stats;
        }